

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymdeltat.c
# Opt level: O1

void YM_DELTAT_ADPCM_Init
               (YM_DELTAT *DELTAT,int emulation_mode,int portshift,INT32 *output_ptr,
               int output_range)

{
  byte bVar1;
  bool bVar2;
  
  DELTAT->emulation_mode = (UINT8)emulation_mode;
  bVar2 = (UINT8)emulation_mode == '\x01';
  DELTAT->control2 = bVar2;
  DELTAT->portstate = bVar2 << 5;
  DELTAT->portshift_base = (UINT8)portshift;
  DELTAT->output_pointer = output_ptr;
  DELTAT->output_range = output_range;
  bVar1 = (UINT8)portshift - "\x03"[bVar2];
  DELTAT->now_portshift = bVar1;
  DELTAT->address_mask = (0x20000 << (bVar1 & 0x1f)) - 1;
  return;
}

Assistant:

void YM_DELTAT_ADPCM_Init(YM_DELTAT *DELTAT,int emulation_mode,int portshift,INT32* output_ptr,int output_range)
{
	DELTAT->emulation_mode = (UINT8)emulation_mode;
	if (DELTAT->emulation_mode == YM_DELTAT_EMULATION_MODE_YM2610)
	{
		DELTAT->portstate = 0x20;
		DELTAT->control2  = 0x01;
	}
	else
	{
		DELTAT->portstate = 0x00;
		DELTAT->control2  = 0x00;	/* default setting depends on the emulation mode. MSX demo called "facdemo_4" doesn't setup control2 register at all and still works */
	}
	DELTAT->portshift_base = (UINT8)portshift;
	DELTAT->output_pointer = output_ptr;
	DELTAT->output_range = output_range;
	DELTAT->now_portshift = DELTAT->portshift_base - dram_rightshift[DELTAT->control2 & 3];
	DELTAT->address_mask = (0x10000 << (DELTAT->now_portshift + 1)) - 1;
}